

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O0

bool bssl::tls_add_message(SSL *ssl,Array<unsigned_char> *msg)

{
  SSL3_STATE *pSVar1;
  bool bVar2;
  int iVar3;
  pointer this;
  size_t sVar4;
  BUF_MEM *__p;
  pointer pbVar5;
  uchar *in;
  pointer pSVar6;
  size_t in_R8;
  size_t in_R9;
  Span<const_unsigned_char> SVar7;
  Span<const_unsigned_char> in_00;
  size_t local_b8;
  Span<const_unsigned_char> local_a8;
  int local_98 [2];
  uchar *local_90;
  Span<const_unsigned_char> local_88;
  undefined1 local_78 [8];
  Span<const_unsigned_char> chunk_1;
  size_t pending_len;
  uchar *local_50;
  undefined1 local_40 [8];
  Span<const_unsigned_char> chunk;
  Span<const_unsigned_char> rest;
  Array<unsigned_char> *msg_local;
  SSL *ssl_local;
  
  Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
            ((Span<unsigned_char_const> *)&chunk.size_,msg);
  iVar3 = SSL_is_quic(ssl);
  if (iVar3 == 0) {
    this = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                     (&ssl->s3->aead_write_ctx);
    bVar2 = SSLAEADContext::is_null_cipher(this);
    if (bVar2) {
      while( true ) {
        bVar2 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&chunk.size_);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        _local_40 = Span<const_unsigned_char>::subspan
                              ((Span<const_unsigned_char> *)&chunk.size_,0,
                               (ulong)ssl->max_send_fragment);
        sVar4 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_40);
        SVar7 = Span<const_unsigned_char>::subspan
                          ((Span<const_unsigned_char> *)&chunk.size_,sVar4,0xffffffffffffffff);
        local_50 = SVar7.data_;
        chunk.size_ = (size_t)local_50;
        SVar7.size_ = in_R8;
        SVar7.data_ = chunk.data_;
        bVar2 = add_record_to_flight((bssl *)ssl,(SSL *)0x16,local_40[0],SVar7);
        if (!bVar2) {
          return false;
        }
      }
      goto LAB_0035e96d;
    }
  }
  while( true ) {
    bVar2 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&chunk.size_);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->s3->pending_hs_data);
    if (((bVar2) &&
        (pbVar5 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->
                            (&ssl->s3->pending_hs_data),
        (ulong)ssl->max_send_fragment <= pbVar5->length)) &&
       (bVar2 = tls_flush_pending_hs_data(ssl), !bVar2)) {
      return false;
    }
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->s3->pending_hs_data);
    if (bVar2) {
      pbVar5 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->
                         (&ssl->s3->pending_hs_data);
      local_b8 = pbVar5->length;
    }
    else {
      local_b8 = 0;
    }
    chunk_1.size_ = local_b8;
    _local_78 = Span<const_unsigned_char>::subspan
                          ((Span<const_unsigned_char> *)&chunk.size_,0,
                           ssl->max_send_fragment - local_b8);
    bVar2 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)local_78);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!chunk.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                    ,0x7a,"bool bssl::tls_add_message(SSL *, Array<uint8_t>)");
    }
    sVar4 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_78);
    local_88 = Span<const_unsigned_char>::subspan
                         ((Span<const_unsigned_char> *)&chunk.size_,sVar4,0xffffffffffffffff);
    chunk.size_ = (size_t)local_88.data_;
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->s3->pending_hs_data);
    if (!bVar2) {
      pSVar1 = ssl->s3;
      __p = BUF_MEM_new();
      std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::reset
                (&pSVar1->pending_hs_data,(pointer)__p);
    }
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->s3->pending_hs_data);
    if (!bVar2) {
      return false;
    }
    pbVar5 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::get(&ssl->s3->pending_hs_data);
    in = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_78);
    sVar4 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_78);
    iVar3 = BUF_MEM_append(pbVar5,in,sVar4);
    if (iVar3 == 0) {
      return false;
    }
  }
LAB_0035e96d:
  Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
            ((Span<unsigned_char_const> *)local_98,msg);
  in_00.size_ = in_R9;
  in_00.data_ = local_90;
  ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x16,local_98[0],in_00);
  bVar2 = std::operator!=(&ssl->s3->hs,(nullptr_t)0x0);
  if (bVar2) {
    pSVar6 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->(&ssl->s3->hs)
    ;
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_a8,msg);
    bVar2 = SSLTranscript::Update(&pSVar6->transcript,local_a8);
    if (!bVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool tls_add_message(SSL *ssl, Array<uint8_t> msg) {
  // Pack handshake data into the minimal number of records. This avoids
  // unnecessary encryption overhead, notably in TLS 1.3 where we send several
  // encrypted messages in a row. For now, we do not do this for the null
  // cipher. The benefit is smaller and there is a risk of breaking buggy
  // implementations.
  //
  // TODO(crbug.com/374991962): See if we can do this uniformly.
  Span<const uint8_t> rest = msg;
  if (!SSL_is_quic(ssl) && ssl->s3->aead_write_ctx->is_null_cipher()) {
    while (!rest.empty()) {
      Span<const uint8_t> chunk = rest.subspan(0, ssl->max_send_fragment);
      rest = rest.subspan(chunk.size());

      if (!add_record_to_flight(ssl, SSL3_RT_HANDSHAKE, chunk)) {
        return false;
      }
    }
  } else {
    while (!rest.empty()) {
      // Flush if |pending_hs_data| is full.
      if (ssl->s3->pending_hs_data &&
          ssl->s3->pending_hs_data->length >= ssl->max_send_fragment &&
          !tls_flush_pending_hs_data(ssl)) {
        return false;
      }

      size_t pending_len =
          ssl->s3->pending_hs_data ? ssl->s3->pending_hs_data->length : 0;
      Span<const uint8_t> chunk =
          rest.subspan(0, ssl->max_send_fragment - pending_len);
      assert(!chunk.empty());
      rest = rest.subspan(chunk.size());

      if (!ssl->s3->pending_hs_data) {
        ssl->s3->pending_hs_data.reset(BUF_MEM_new());
      }
      if (!ssl->s3->pending_hs_data ||
          !BUF_MEM_append(ssl->s3->pending_hs_data.get(), chunk.data(),
                          chunk.size())) {
        return false;
      }
    }
  }

  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_HANDSHAKE, msg);
  // TODO(svaldez): Move this up a layer to fix abstraction for SSLTranscript on
  // hs.
  if (ssl->s3->hs != NULL &&  //
      !ssl->s3->hs->transcript.Update(msg)) {
    return false;
  }
  return true;
}